

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O1

bool __thiscall
double_conversion::DoubleToStringConverter::ToFixed
          (DoubleToStringConverter *this,double value,int requested_digits,
          StringBuilder *result_builder)

{
  int iVar1;
  bool bVar2;
  long in_FS_OFFSET;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  char decimal_rep [161];
  int local_f4;
  bool local_ed;
  int local_ec;
  char local_e8 [176];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    bVar2 = false;
    if ((requested_digits < 0x65) && (bVar2 = false, ABS(value) < 1e+60)) {
      local_ec = -0x55555556;
      local_ed = true;
      memset(local_e8,0xaa,0xa1);
      local_f4 = -0x55555556;
      DoubleToAscii(value,FIXED,requested_digits,local_e8,0xa1,&local_ed,&local_f4,&local_ec);
      if ((local_ed == true) && (value != 0.0 || (this->flags_ & 8U) == 0)) {
        iVar1 = *(int *)(result_builder + 0x10);
        *(int *)(result_builder + 0x10) = iVar1 + 1;
        *(undefined1 *)(*(long *)result_builder + (long)iVar1) = 0x2d;
      }
      CreateDecimalRepresentation(this,local_e8,local_f4,local_ec,requested_digits,result_builder);
      bVar2 = true;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return bVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    bVar2 = HandleSpecialValues(this,value,result_builder);
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToFixed(double value,
                                      int requested_digits,
                                      StringBuilder* result_builder) const {
  DOUBLE_CONVERSION_ASSERT(kMaxFixedDigitsBeforePoint == 60);
  const double kFirstNonFixed = 1e60;

  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (requested_digits > kMaxFixedDigitsAfterPoint) return false;
  if (value >= kFirstNonFixed || value <= -kFirstNonFixed) return false;

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add space for the '\0' byte.
  const int kDecimalRepCapacity =
      kMaxFixedDigitsBeforePoint + kMaxFixedDigitsAfterPoint + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;
  DoubleToAscii(value, FIXED, requested_digits,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                              requested_digits, result_builder);
  return true;
}